

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall
cashew::ValueBuilder::appendArgumentToFunction(ValueBuilder *this,Ref func,IString arg)

{
  Value *this_00;
  bool bVar1;
  Ref *pRVar2;
  Ref r;
  undefined1 *__ptr;
  Ref local_30;
  Ref func_local;
  
  local_30.inst = (Value *)this;
  pRVar2 = Ref::operator[](&local_30,0);
  bVar1 = Ref::operator==(pRVar2,(IString *)&DEFUN);
  if (bVar1) {
    pRVar2 = Ref::operator[](&local_30,2);
    this_00 = pRVar2->inst;
    __ptr = &DAT_00000018;
    r.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
    (r.inst)->type = Null;
    cashew::Value::free(r.inst,__ptr);
    (r.inst)->type = String;
    ((r.inst)->field_1).ref.inst = func.inst;
    ((r.inst)->field_1).str.str._M_str = (char *)arg.str._M_len;
    cashew::Value::push_back(this_00,r);
    return;
  }
  __assert_fail("func[0] == DEFUN",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x67d,"static void cashew::ValueBuilder::appendArgumentToFunction(Ref, IString)");
}

Assistant:

static void appendArgumentToFunction(Ref func, IString arg) {
    assert(func[0] == DEFUN);
    func[2]->push_back(makeRawString(arg));
  }